

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall
mkvparser::Track::ParseContentEncodingsEntry(Track *this,longlong start,longlong size)

{
  longlong lVar1;
  long lVar2;
  ContentEncoding **ppCVar3;
  ContentEncoding *this_00;
  ulong uVar4;
  long stop;
  longlong lVar5;
  longlong pos;
  longlong size_1;
  longlong id;
  IMkvReader *local_40;
  Track *local_38;
  
  local_40 = this->m_pSegment->m_pReader;
  local_38 = this;
  if (local_40 == (IMkvReader *)0x0) {
    __assert_fail("pReader",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1347,"long mkvparser::Track::ParseContentEncodingsEntry(long long, long long)")
    ;
  }
  stop = size + start;
  uVar4 = 0;
  pos = start;
  while (pos < stop) {
    lVar2 = ParseElementHeader(local_40,&pos,stop,&id,&size_1);
    if (lVar2 < 0) {
      return lVar2;
    }
    if (id == 0x6240) {
      if (0x7ffffffe < (long)uVar4) {
        return -1;
      }
      uVar4 = uVar4 + 1;
    }
    pos = pos + size_1;
    if (stop < pos) {
      return -2;
    }
  }
  if ((long)uVar4 < 1) {
    return -1;
  }
  ppCVar3 = (ContentEncoding **)
            operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 << 3,(nothrow_t *)&std::nothrow);
  local_38->content_encoding_entries_ = ppCVar3;
  if (ppCVar3 != (ContentEncoding **)0x0) {
    local_38->content_encoding_entries_end_ = ppCVar3;
    pos = start;
    do {
      if (stop <= pos) {
        return (ulong)(pos == stop) * 2 + -2;
      }
      lVar2 = ParseElementHeader(local_40,&pos,stop,&id,&size_1);
      if (lVar2 < 0) {
        return lVar2;
      }
      lVar5 = size_1;
      if (id == 0x6240) {
        this_00 = (ContentEncoding *)operator_new(0x38,(nothrow_t *)&std::nothrow);
        lVar5 = size_1;
        lVar1 = pos;
        if (this_00 == (ContentEncoding *)0x0) {
          return -1;
        }
        this_00->encryption_entries_ = (ContentEncryption **)0x0;
        this_00->encryption_entries_end_ = (ContentEncryption **)0x0;
        this_00->compression_entries_ = (ContentCompression **)0x0;
        this_00->compression_entries_end_ = (ContentCompression **)0x0;
        this_00->encoding_order_ = 0;
        this_00->encoding_scope_ = 1;
        this_00->encoding_type_ = 0;
        lVar2 = ContentEncoding::ParseContentEncodingEntry(this_00,pos,size_1,local_40);
        if (lVar2 != 0) {
          ContentEncoding::~ContentEncoding(this_00);
          operator_delete(this_00);
          return lVar2;
        }
        ppCVar3 = local_38->content_encoding_entries_end_;
        local_38->content_encoding_entries_end_ = ppCVar3 + 1;
        *ppCVar3 = this_00;
        pos = lVar1;
      }
      pos = pos + lVar5;
      if (stop < pos) {
        return -2;
      }
    } while( true );
  }
  return -1;
}

Assistant:

long Track::ParseContentEncodingsEntry(long long start, long long size) {
  IMkvReader* const pReader = m_pSegment->m_pReader;
  assert(pReader);

  long long pos = start;
  const long long stop = start + size;

  // Count ContentEncoding elements.
  long long count = 0;
  while (pos < stop) {
    long long id, size;
    const long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ++count;
      if (count > INT_MAX)
        return E_PARSE_FAILED;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (count <= 0)
    return -1;

  content_encoding_entries_ =
      new (std::nothrow) ContentEncoding*[static_cast<size_t>(count)];
  if (!content_encoding_entries_)
    return -1;

  content_encoding_entries_end_ = content_encoding_entries_;

  pos = start;
  while (pos < stop) {
    long long id, size;
    long status = ParseElementHeader(pReader, pos, stop, id, size);
    if (status < 0)  // error
      return status;

    // pos now designates start of element
    if (id == libwebm::kMkvContentEncoding) {
      ContentEncoding* const content_encoding =
          new (std::nothrow) ContentEncoding();
      if (!content_encoding)
        return -1;

      status = content_encoding->ParseContentEncodingEntry(pos, size, pReader);
      if (status) {
        delete content_encoding;
        return status;
      }

      *content_encoding_entries_end_++ = content_encoding;
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}